

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachments
          (Impl *this,Value *attachments,VkAttachmentReference **out_references)

{
  SizeType SVar1;
  VkAttachmentReference *pVVar2;
  ConstValueIterator pGVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  ConstValueIterator itr;
  VkAttachmentReference *ret;
  VkAttachmentReference *refs;
  VkAttachmentReference **out_references_local;
  Value *attachments_local;
  Impl *this_local;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(attachments);
  pVVar2 = ScratchAllocator::allocate_n_cleared<VkAttachmentReference>
                     (&this->allocator,(ulong)SVar1);
  value = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Begin(attachments);
  ret = pVVar2;
  while( true ) {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(attachments);
    if (value == pGVar3) break;
    parse_attachment_base<VkAttachmentReference>(ret,value);
    value = value + 1;
    ret = ret + 1;
  }
  *out_references = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachments(const Value &attachments, const VkAttachmentReference **out_references)
{
	auto *refs = allocator.allocate_n_cleared<VkAttachmentReference>(attachments.Size());
	auto *ret = refs;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, refs++)
	{
		auto &value = *itr;
		parse_attachment_base(*refs, value);
	}

	*out_references = ret;
	return true;
}